

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O3

void melee_effect_timed(melee_effect_handler_context_t *context,wchar_t type,wchar_t amount,
                       wchar_t of_flag,_Bool save,char *save_msg)

{
  _Bool _Var1;
  uint32_t uVar2;
  player *p;
  
  _Var1 = monster_damage_target(context,false);
  if (!_Var1) {
    if (context->t_mon == (monster_conflict *)0x0) {
      if (!save) {
        p = context->p;
LAB_0016724b:
        _Var1 = player_inc_timed(p,type,amount,true,true,true);
        if (_Var1) {
          context->obvious = true;
        }
        update_smart_learn(context->mon,context->p,of_flag,L'\0',L'\xffffffff');
        return;
      }
      uVar2 = Rand_div(100);
      p = context->p;
      if ((p->state).skills[3] <= (int)uVar2) goto LAB_0016724b;
      if (save_msg != (char *)0x0) {
        msg("%s",save_msg);
      }
    }
    else {
      mon_inc_timed((monster *)context->t_mon,
                    *(wchar_t *)("You feel your life draining away!" + (long)type * 4 + 0x1d),amount
                    ,L'\0');
    }
    context->obvious = true;
  }
  return;
}

Assistant:

static void melee_effect_timed(melee_effect_handler_context_t *context,
							   int type, int amount, int of_flag, bool save,
							   const char *save_msg)
{
	/* Take damage */
	if (monster_damage_target(context, false)) return;

	/* Handle status */
	if (context->t_mon) {
		/* Translate to monster timed effect */
		int mon_tmd_effect = -1;

		/* Will do until monster and player timed effects are fused */
		switch (type) {
			case TMD_CONFUSED: {
				mon_tmd_effect = MON_TMD_CONF;
				break;
			}
			case TMD_PARALYZED: {
				mon_tmd_effect = MON_TMD_HOLD;
				break;
			}
			case TMD_BLIND: {
				mon_tmd_effect = MON_TMD_STUN;
				break;
			}
			case TMD_AFRAID: {
				mon_tmd_effect = MON_TMD_FEAR;
				break;
			}
			default: {
				break;
			}
		}
		if (mon_tmd_effect >= 0) {
			mon_inc_timed(context->t_mon, mon_tmd_effect, amount, 0);
			context->obvious = true;
		}
	} else if (save && randint0(100) < context->p->state.skills[SKILL_SAVE]) {
		/* Attempt a saving throw if desired. */
		if (save_msg != NULL) {
			msg("%s", save_msg);
		}
		context->obvious = true;
	} else {
		/* Increase timer for type. */
		if (player_inc_timed(context->p, type, amount, true, true,
				true)) {
			context->obvious = true;
		}

		/* Learn about the player */
		update_smart_learn(context->mon, context->p, of_flag, 0, -1);
	}
}